

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O0

mbedtls_pk_info_t * mbedtls_pk_info_from_type(mbedtls_pk_type_t pk_type)

{
  mbedtls_pk_info_t *pmStack_10;
  mbedtls_pk_type_t pk_type_local;
  
  switch(pk_type) {
  case MBEDTLS_PK_RSA:
    pmStack_10 = &mbedtls_rsa_info;
    break;
  case MBEDTLS_PK_ECKEY:
    pmStack_10 = &mbedtls_eckey_info;
    break;
  case MBEDTLS_PK_ECKEY_DH:
    pmStack_10 = &mbedtls_eckeydh_info;
    break;
  case MBEDTLS_PK_ECDSA:
    pmStack_10 = &mbedtls_ecdsa_info;
    break;
  default:
    pmStack_10 = (mbedtls_pk_info_t *)0x0;
  }
  return pmStack_10;
}

Assistant:

const mbedtls_pk_info_t * mbedtls_pk_info_from_type( mbedtls_pk_type_t pk_type )
{
    switch( pk_type ) {
#if defined(MBEDTLS_RSA_C)
        case MBEDTLS_PK_RSA:
            return( &mbedtls_rsa_info );
#endif
#if defined(MBEDTLS_ECP_C)
        case MBEDTLS_PK_ECKEY:
            return( &mbedtls_eckey_info );
        case MBEDTLS_PK_ECKEY_DH:
            return( &mbedtls_eckeydh_info );
#endif
#if defined(MBEDTLS_ECDSA_C)
        case MBEDTLS_PK_ECDSA:
            return( &mbedtls_ecdsa_info );
#endif
        /* MBEDTLS_PK_RSA_ALT omitted on purpose */
        default:
            return( NULL );
    }
}